

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::TPZParFrontMatrix
          (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *this,
          int64_t globalsize)

{
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::TPZFrontMatrix
            (&this->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>,
             &PTR_PTR_019b8690,globalsize);
  (this->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>).
  super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZParFrontMatrix_019b8408;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>.
  super_TPZVec<TPZEqnArray<double>_*>.fStore = (TPZEqnArray<double> **)0x0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>.
  super_TPZVec<TPZEqnArray<double>_*>.fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>.
  super_TPZVec<TPZEqnArray<double>_*>.fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>.
  super_TPZVec<TPZEqnArray<double>_*>.fStore =
       (this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>.fExtAlloc;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>.
  super_TPZVec<TPZEqnArray<double>_*>.fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>.
  super_TPZVec<TPZEqnArray<double>_*>.fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>.
  super_TPZVec<TPZEqnArray<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019c9a60;
  this->fFinish = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->fwritecond);
  TPZManVector<TPZEqnArray<double>_*,_10>::Resize
            (&(this->fEqnStack).super_TPZManVector<TPZEqnArray<double>_*,_10>,0);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix(int64_t globalsize) :
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), TPZFrontMatrix<TVar, store, front>(globalsize),
fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}